

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O3

bool_t strIsNumeric(char *str)

{
  char cVar1;
  char *pcVar2;
  
  cVar1 = *str;
  if (cVar1 != '\0') {
    pcVar2 = str + 1;
    do {
      if ((byte)(cVar1 - 0x3aU) < 0xf6) {
        return 0;
      }
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar1 != '\0');
  }
  return 1;
}

Assistant:

bool_t strIsNumeric(const char* str)
{
	ASSERT(strIsValid(str));
	for (; *str; ++str)
		if (*str < '0' || *str > '9')
			return FALSE;
	return TRUE;
}